

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall r_code::View::~View(View *this)

{
  Atom *local_18;
  View *this_local;
  
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__View_002ea378;
  local_18 = (Atom *)&this->field_0x5c;
  do {
    local_18 = local_18 + -4;
    r_code::Atom::~Atom(local_18);
  } while (local_18 != (Atom *)&this->field_0x28);
  core::P<r_code::Code>::~P(&this->object);
  core::_Object::~_Object(&this->super__Object);
  return;
}

Assistant:

virtual ~View() {}